

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char ** hts_idx_seqnames(hts_idx_t *idx,int *n,hts_id2name_f getid,void *hdr)

{
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  size_t __nmemb;
  long lVar4;
  int iVar5;
  
  __nmemb = (size_t)idx->n;
  if (__nmemb == 0) {
    iVar5 = 0;
    ppcVar1 = (char **)0x0;
  }
  else {
    ppcVar1 = (char **)calloc(__nmemb,8);
    iVar5 = 0;
    for (lVar4 = 0; lVar4 < (int)__nmemb; lVar4 = lVar4 + 1) {
      if (idx->bidx[lVar4] != (bidx_t *)0x0) {
        pcVar2 = (*getid)(hdr,(int)lVar4);
        lVar3 = (long)iVar5;
        iVar5 = iVar5 + 1;
        ppcVar1[lVar3] = pcVar2;
        __nmemb = (size_t)(uint)idx->n;
      }
    }
  }
  *n = iVar5;
  return ppcVar1;
}

Assistant:

const char **hts_idx_seqnames(const hts_idx_t *idx, int *n, hts_id2name_f getid, void *hdr)
{
    if ( !idx->n )
    {
        *n = 0;
        return NULL;
    }

    int tid = 0, i;
    const char **names = (const char**) calloc(idx->n,sizeof(const char*));
    for (i=0; i<idx->n; i++)
    {
        bidx_t *bidx = idx->bidx[i];
        if ( !bidx ) continue;
        names[tid++] = getid(hdr,i);
    }
    *n = tid;
    return names;
}